

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_Shutdown(void)

{
  ImGui_ImplGlfw_Data *p;
  ImGuiIO *pIVar1;
  long lVar2;
  
  p = ImGui_ImplGlfw_GetBackendData();
  pIVar1 = ImGui::GetIO();
  if (p->InstalledCallbacks == true) {
    ImGui_ImplGlfw_RestoreCallbacks(p->Window);
  }
  for (lVar2 = 4; lVar2 != 0xd; lVar2 = lVar2 + 1) {
    glfwDestroyCursor(p->MouseCursors[lVar2 + -4]);
  }
  pIVar1->BackendPlatformName = (char *)0x0;
  pIVar1->BackendPlatformUserData = (void *)0x0;
  IM_DELETE<ImGui_ImplGlfw_Data>(p);
  return;
}

Assistant:

void ImGui_ImplGlfw_Shutdown()
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd != nullptr && "No platform backend to shutdown, or already shutdown?");
    ImGuiIO& io = ImGui::GetIO();

    if (bd->InstalledCallbacks)
        ImGui_ImplGlfw_RestoreCallbacks(bd->Window);

    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
        glfwDestroyCursor(bd->MouseCursors[cursor_n]);

    io.BackendPlatformName = nullptr;
    io.BackendPlatformUserData = nullptr;
    IM_DELETE(bd);
}